

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O3

void NULLC::CollectMemory(void)

{
  clock_t cVar1;
  clock_t cVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  
  if (collectionEnabled == '\x01') {
    cVar1 = clock();
    MarkMemory(0);
    GC::MarkUsedBlocks();
    CollectUnmarked();
    cVar2 = clock();
    auVar3._0_8_ = (double)cVar2;
    auVar3._8_8_ = (double)cVar1;
    auVar3 = divpd(auVar3,_DAT_001e9860);
    markTime = (auVar3._0_8_ - auVar3._8_8_) + markTime;
    cVar1 = clock();
    FinalizePending();
    FreePending();
    cVar2 = clock();
    auVar4._0_8_ = (double)cVar2;
    auVar4._8_8_ = (double)cVar1;
    auVar3 = divpd(auVar4,_DAT_001e9860);
    collectTime = (auVar3._0_8_ - auVar3._8_8_) + collectTime;
    if (collectableMinimum <= (usedMemory >> 1) + usedMemory) {
      collectableMinimum = collectableMinimum * 2;
    }
    nullcRunFunction("__finalizeObjects");
    DAT_002438c4 = 0;
  }
  return;
}

Assistant:

void NULLC::CollectMemory()
{
	if(!collectionEnabled)
		return;

	double time = (double(clock()) / CLOCKS_PER_SEC);

	// All memory blocks are marked with 0
	MarkMemory(0);

	// Used memory blocks are marked with 1
	GC::MarkUsedBlocks();

	// Collect sets of objects to finalize and to potentially free
	CollectUnmarked();

	markTime += (double(clock()) / CLOCKS_PER_SEC) - time;
	time = (double(clock()) / CLOCKS_PER_SEC);

	// Ressurect objects and register finalizers
	FinalizePending();

	// Free memory that remains unreachable
	FreePending();

	collectTime += (double(clock()) / CLOCKS_PER_SEC) - time;

	if(usedMemory + (usedMemory >> 1) >= collectableMinimum)
		collectableMinimum <<= 1;

	(void)nullcRunFunction("__finalizeObjects");
	finalizeList.clear();
}